

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O0

void __thiscall Infector::AnyShared<GoodClassVS>::setPtr(AnyShared<GoodClassVS> *this,void *p)

{
  exception *ex;
  GoodClassVS *tp;
  void *p_local;
  AnyShared<GoodClassVS> *this_local;
  
  std::__shared_ptr<GoodClassVS,_(__gnu_cxx::_Lock_policy)2>::reset<GoodClassVS>
            (&(this->ist).super___shared_ptr<GoodClassVS,_(__gnu_cxx::_Lock_policy)2>,
             (GoodClassVS *)p);
  resolve_multiple_cast<GoodClassVS>(this,(GoodClassVS *)p);
  return;
}

Assistant:

virtual void setPtr(void * p) override {
            T* tp = reinterpret_cast<T*>(p);
            try{
                ist.reset(tp);
                resolve_multiple_cast<T,Bases...>(tp);
            }catch(std::exception & ex){
                multi_solver.clear();
                throw ex;
            }catch(...){
                multi_solver.clear();
                throw ExUnkownException();
            }
        }